

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

QSize __thiscall QTabBar::minimumTabSizeHint(QTabBar *this,int index)

{
  byte *pbVar1;
  long lVar2;
  QString *this_00;
  char16_t *pcVar3;
  qsizetype qVar4;
  QLatin1String *pQVar5;
  QSize QVar6;
  QArrayData *pQVar7;
  long in_FS_OFFSET;
  QString ret;
  QString local_b8;
  QArrayData *local_98;
  QArrayData *pQStack_90;
  QArrayData *local_88;
  QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView> local_78;
  QStringBuilder<QStringView,_const_QLatin1String_&> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  this_00 = *(QString **)(*(long *)(lVar2 + 0x2e0) + (long)index * 8);
  local_98 = &((this_00->d).d)->super_QArrayData;
  pQStack_90 = (QArrayData *)(this_00->d).ptr;
  local_88 = (QArrayData *)(this_00->d).size;
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_88 < (QArrayData *)0x4) {
    local_b8.d.d = (Data *)local_98;
    local_b8.d.ptr = (char16_t *)pQStack_90;
    local_b8.d.size = (qsizetype)local_88;
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto switchD_00494f8d_default;
  }
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  switch(*(undefined4 *)(lVar2 + 0x2ac)) {
  case 0:
    local_48.a.m_data = (storage_type_conflict *)(QArrayData *)0x2;
    if (local_88 < (QArrayData *)0x2) {
      local_48.a.m_data = (storage_type_conflict *)local_88;
    }
    local_48.b = (QLatin1String *)
                 ((long)pQStack_90 +
                 ((long)local_88 * 2 - (ulong)(uint)((int)local_48.a.m_data * 2)));
    local_48.a.m_size = (qsizetype)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    QStringBuilder<const_QLatin1String_&,_QStringView>::convertTo<QString>
              ((QString *)&local_78,(QStringBuilder<const_QLatin1String_&,_QStringView> *)&local_48)
    ;
    break;
  case 1:
    local_48.a.m_size = (qsizetype)(QArrayData *)0x2;
    if (local_88 < (QArrayData *)0x2) {
      local_48.a.m_size = (qsizetype)local_88;
    }
    local_48.b = (QLatin1String *)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    local_48.a.m_data = (storage_type_conflict *)pQStack_90;
    QStringBuilder<QStringView,_const_QLatin1String_&>::convertTo<QString>
              ((QString *)&local_78,&local_48);
    break;
  case 2:
    local_78.b.m_data = (storage_type_conflict *)((long)pQStack_90 + (long)local_88 * 2 + -2);
    local_78.a.a.m_size = 1;
    local_78.a.b = (QLatin1String *)computeElidedText(Qt::TextElideMode,QString_const&)::Ellipses;
    local_78.b.m_size = 1;
    local_78.a.a.m_data = (storage_type_conflict *)pQStack_90;
    QStringBuilder<QStringBuilder<QStringView,_const_QLatin1String_&>,_QStringView>::
    convertTo<QString>((QString *)&local_48,&local_78);
    pQVar5 = local_48.b;
    qVar4 = local_48.a.m_size;
    pcVar3 = local_b8.d.ptr;
    pQVar7 = &(local_b8.d.d)->super_QArrayData;
    local_48.a.m_size = (qsizetype)local_b8.d.d;
    local_b8.d.d = (Data *)qVar4;
    local_b8.d.ptr = local_48.a.m_data;
    local_48.a.m_data = pcVar3;
    local_48.b = (QLatin1String *)local_b8.d.size;
    local_b8.d.size = (qsizetype)pQVar5;
    if (pQVar7 == (QArrayData *)0x0) goto switchD_00494f8d_default;
    LOCK();
    (((Data *)pQVar7)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)pQVar7)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((Data *)pQVar7)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto switchD_00494f8d_default;
    goto LAB_004950c3;
  case 3:
    QString::operator=(&local_b8,(QString *)&local_98);
  default:
    goto switchD_00494f8d_default;
  }
  pQVar5 = local_78.a.b;
  qVar4 = local_78.a.a.m_size;
  pcVar3 = local_b8.d.ptr;
  pQVar7 = &(local_b8.d.d)->super_QArrayData;
  local_78.a.a.m_size = (qsizetype)local_b8.d.d;
  local_b8.d.d = (Data *)qVar4;
  local_b8.d.ptr = local_78.a.a.m_data;
  local_78.a.a.m_data = pcVar3;
  local_78.a.b = (QLatin1String *)local_b8.d.size;
  local_b8.d.size = (qsizetype)pQVar5;
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (((Data *)pQVar7)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)pQVar7)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((Data *)pQVar7)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_004950c3:
      QArrayData::deallocate(pQVar7,2,0x10);
    }
  }
switchD_00494f8d_default:
  pQVar7 = &((this_00->d).d)->super_QArrayData;
  (this_00->d).d = local_b8.d.d;
  pcVar3 = (this_00->d).ptr;
  (this_00->d).ptr = local_b8.d.ptr;
  qVar4 = (this_00->d).size;
  (this_00->d).size = local_b8.d.size;
  local_b8.d.d = (Data *)pQVar7;
  local_b8.d.ptr = pcVar3;
  local_b8.d.size = qVar4;
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar7,2,0x10);
    }
  }
  pbVar1 = (byte *)((long)&this_00[9].d.ptr + 4);
  *pbVar1 = *pbVar1 | 4;
  QVar6 = (QSize)(**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,index);
  QString::operator=(this_00,(QString *)&local_98);
  pbVar1 = (byte *)((long)&this_00[9].d.ptr + 4);
  *pbVar1 = *pbVar1 & 0xfb;
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return QVar6;
}

Assistant:

QSize QTabBar::minimumTabSizeHint(int index) const
{
    Q_D(const QTabBar);
    QTabBarPrivate::Tab *tab = d->tabList.at(index);
    QString oldText = tab->text;
    tab->text = computeElidedText(d->elideMode, oldText);
    tab->measuringMinimum = true;
    QSize size = tabSizeHint(index);
    tab->text = oldText;
    tab->measuringMinimum = false;
    return size;
}